

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

size_t __thiscall
CCharmapToUniSB::map(CCharmapToUniSB *this,char **outp,size_t *outlen,char *inp,size_t inlen)

{
  wchar_t ch;
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (inlen == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = *outlen;
    sVar5 = 0;
    sVar3 = 0;
    do {
      ch = *(wchar_t *)
            (&(this->super_CCharmapToUniSB_basic).field_0x20c + (ulong)(byte)inp[sVar5] * 4);
      uVar4 = 3 - (ulong)((uint)ch < 0x800);
      if (ch < L'\x80') {
        uVar4 = 1;
      }
      if (uVar2 < uVar4) {
        uVar2 = 0;
      }
      else {
        sVar1 = utf8_ptr::s_putch(*outp,ch);
        *outp = *outp + sVar1;
        uVar2 = *outlen - uVar4;
      }
      sVar3 = sVar3 + uVar4;
      *outlen = uVar2;
      sVar5 = sVar5 + 1;
    } while (inlen != sVar5);
  }
  return sVar3;
}

Assistant:

size_t CCharmapToUniSB::map(char **outp, size_t *outlen,
                            const char *inp, size_t inlen) const
{
    size_t tot_outlen;

    /* we haven't written any characters to the output buffer yet */
    tot_outlen = 0;

    /* scan each character (character == byte) in the input string */
    for ( ; inlen > 0 ; --inlen, ++inp)
    {
        wchar_t uni;
        size_t csiz;
        
        /* get the unicode mapping for this character */
        uni = map_[(unsigned char)*inp];

        /* get the size of this character */
        csiz = utf8_ptr::s_wchar_size(uni);

        /* add it to the total output lenght */
        tot_outlen += csiz;

        /* if there's room, add it to our output buffer */
        if (*outlen >= csiz)
        {
            /* write it out */
            *outp += utf8_ptr::s_putch(*outp, uni);
            
            /* deduct it from the remaining output length */
            *outlen -= csiz;
        }
        else
        {
            /* there's no room - set the remaining output length to zero */
            *outlen = 0;
        }
    }

    /* return the total output length */
    return tot_outlen;
}